

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O3

char * match(MatchState *ms,char *s,char *p)

{
  int *piVar1;
  byte bVar2;
  MatchState *ms_00;
  int iVar3;
  uint uVar4;
  byte *pbVar5;
  byte *pbVar6;
  ulong uVar7;
  ptrdiff_t *ppVar8;
  long lVar9;
  byte *s_00;
  byte *pbVar10;
  
  piVar1 = &ms->matchdepth;
  iVar3 = *piVar1;
  *piVar1 = *piVar1 + -1;
  if (iVar3 == 0) {
    luaL_error(ms->L,"pattern too complex");
  }
LAB_00117b56:
  do {
    s_00 = (byte *)s;
    pbVar5 = (byte *)p;
LAB_00117b5d:
    pbVar10 = (byte *)ms->p_end;
    pbVar6 = s_00;
    if (pbVar5 == pbVar10) goto LAB_00117e84;
    bVar2 = *pbVar5;
    if (bVar2 == 0x25) {
      bVar2 = pbVar5[1];
      if (bVar2 == 0x66) {
        if (pbVar5[2] != 0x5b) {
          luaL_error(ms->L,"missing \'[\' after \'%%f\' in pattern");
        }
        pbVar10 = pbVar5 + 2;
        pbVar5 = (byte *)classend(ms,(char *)pbVar10);
        if (s_00 == (byte *)ms->src_init) {
          uVar4 = 0;
        }
        else {
          uVar4 = (uint)s_00[-1];
        }
        iVar3 = matchbracketclass(uVar4,(char *)pbVar10,(char *)(pbVar5 + -1));
        if ((iVar3 != 0) ||
           (iVar3 = matchbracketclass((uint)*s_00,(char *)pbVar10,(char *)(pbVar5 + -1)), iVar3 == 0
           )) goto LAB_00117e6a;
        goto LAB_00117b5d;
      }
      if (bVar2 - 0x30 < 10) {
        if (((bVar2 < 0x31) || (uVar4 = bVar2 - 0x31, ms->level <= uVar4)) ||
           (ms->capture[uVar4].len == -1)) {
          uVar4 = luaL_error(ms->L,"invalid capture index %%%d");
        }
        uVar7 = ms->capture[(int)uVar4].len;
        if (((ulong)((long)ms->src_end - (long)s_00) < uVar7) ||
           (iVar3 = bcmp(ms->capture[(int)uVar4].init,s_00,uVar7), iVar3 != 0)) goto LAB_00117e6a;
        pbVar6 = (byte *)0x0;
        if (s_00 == (byte *)0x0) goto LAB_00117e84;
        p = (char *)(pbVar5 + 2);
        s = (char *)(s_00 + uVar7);
        goto LAB_00117b56;
      }
      if (bVar2 == 0x62) {
        if (pbVar10 + -1 <= pbVar5 + 2) {
          luaL_error(ms->L,"malformed pattern (missing arguments to \'%%b\')");
        }
        if (*s_00 != pbVar5[2]) goto LAB_00117e6a;
        pbVar10 = s_00 + 1;
        if (ms->src_end <= pbVar10) goto LAB_00117e6a;
        iVar3 = 1;
        goto LAB_00117d77;
      }
    }
    else if (bVar2 == 0x24) {
      if (pbVar5 + 1 == pbVar10) {
        pbVar6 = (byte *)0x0;
        if (s_00 == (byte *)ms->src_end) {
          pbVar6 = s_00;
        }
        goto LAB_00117e84;
      }
    }
    else {
      if (bVar2 == 0x29) {
        uVar7 = (ulong)ms->level;
        ppVar8 = &ms->capture[(ulong)ms->level - 1].len;
        goto LAB_00117e12;
      }
      if (bVar2 == 0x28) {
        if (pbVar5[1] == 0x29) {
          pbVar5 = pbVar5 + 2;
          iVar3 = -2;
        }
        else {
          pbVar5 = pbVar5 + 1;
          iVar3 = -1;
        }
        pbVar6 = (byte *)start_capture(ms,(char *)s_00,(char *)pbVar5,iVar3);
        goto LAB_00117e84;
      }
    }
    p = classend(ms,(char *)pbVar5);
    ms_00 = (MatchState *)ms->src_end;
    iVar3 = singlematch(ms_00,(char *)s_00,(char *)pbVar5,p);
    bVar2 = *p;
    if (iVar3 == 0) {
      if (0x3f < bVar2) goto LAB_00117e6a;
      pbVar6 = (byte *)0x0;
      if ((0x8000240000000000U >> ((ulong)bVar2 & 0x3f) & 1) == 0) goto LAB_00117e84;
      pbVar5 = (byte *)p + 1;
      goto LAB_00117b5d;
    }
    if (bVar2 == 0x3f) {
      pbVar6 = (byte *)match(ms,(char *)(s_00 + 1),(char *)((byte *)p + 1));
      pbVar5 = (byte *)p + 1;
      if (pbVar6 != (byte *)0x0) goto LAB_00117e84;
      goto LAB_00117b5d;
    }
    if (bVar2 == 0x2a) {
LAB_00117ecd:
      lVar9 = -1;
      do {
        iVar3 = singlematch(ms_00,(char *)(s_00 + lVar9 + 1),(char *)pbVar5,p);
        lVar9 = lVar9 + 1;
      } while (iVar3 != 0);
      while (-1 < lVar9) {
        pbVar6 = (byte *)match(ms,(char *)(s_00 + lVar9),(char *)((byte *)p + 1));
        lVar9 = lVar9 + -1;
        if (pbVar6 != (byte *)0x0) goto LAB_00117e84;
      }
      goto LAB_00117e6a;
    }
    if (bVar2 == 0x2b) {
      s_00 = s_00 + 1;
      goto LAB_00117ecd;
    }
    s = (char *)(s_00 + 1);
  } while (bVar2 != 0x2d);
  while (pbVar6 = (byte *)match(ms,(char *)s_00,(char *)((byte *)p + 1)), pbVar6 == (byte *)0x0) {
    iVar3 = singlematch((MatchState *)ms->src_end,(char *)s_00,(char *)pbVar5,p);
    if (iVar3 == 0) goto LAB_00117e6a;
    s_00 = s_00 + 1;
  }
LAB_00117e84:
  ms->matchdepth = ms->matchdepth + 1;
  return (char *)pbVar6;
  while( true ) {
    uVar7 = uVar7 - 1;
    lVar9 = *ppVar8;
    ppVar8 = ppVar8 + -2;
    if (lVar9 == -1) break;
LAB_00117e12:
    if ((long)uVar7 < 1) {
      uVar4 = luaL_error(ms->L,"invalid pattern capture");
      uVar7 = (ulong)uVar4;
      break;
    }
  }
  iVar3 = (int)uVar7;
  ms->capture[iVar3].len = (long)s_00 - (long)ms->capture[iVar3].init;
  pbVar6 = (byte *)match(ms,(char *)s_00,(char *)(pbVar5 + 1));
  if (pbVar6 == (byte *)0x0) {
    ms->capture[iVar3].len = -1;
LAB_00117e6a:
    pbVar6 = (byte *)0x0;
  }
  goto LAB_00117e84;
LAB_00117d77:
  if (*pbVar10 == pbVar5[3]) {
    iVar3 = iVar3 + -1;
    if (iVar3 == 0) goto LAB_00117d9f;
  }
  else {
    iVar3 = iVar3 + (uint)(*pbVar10 == *s_00);
  }
  pbVar10 = pbVar10 + 1;
  if (pbVar10 == (byte *)ms->src_end) goto LAB_00117e6a;
  goto LAB_00117d77;
LAB_00117d9f:
  p = (char *)(pbVar5 + 4);
  s = (char *)(pbVar10 + 1);
  goto LAB_00117b56;
}

Assistant:

static const char *match(MatchState *ms, const char *s, const char *p) {
    if (ms->matchdepth-- == 0)
        luaL_error(ms->L, "pattern too complex");
    init: /* using goto's to optimize tail recursion */
    if (p != ms->p_end) {  /* end of pattern? */
        switch (*p) {
            case '(': {  /* start capture */
                if (*(p + 1) == ')')  /* position capture? */
                    s = start_capture(ms, s, p + 2, CAP_POSITION);
                else
                    s = start_capture(ms, s, p + 1, CAP_UNFINISHED);
                break;
            }
            case ')': {  /* end capture */
                s = end_capture(ms, s, p + 1);
                break;
            }
            case '$': {
                if ((p + 1) != ms->p_end)  /* is the '$' the last char in pattern? */
                    goto dflt;  /* no; go to default */
                s = (s == ms->src_end) ? s : NULL;  /* check end of string */
                break;
            }
            case L_ESC: {  /* escaped sequences not in the format class[*+?-]? */
                switch (*(p + 1)) {
                    case 'b': {  /* balanced string? */
                        s = matchbalance(ms, s, p + 2);
                        if (s != NULL) {
                            p += 4;
                            goto init;  /* return match(ms, s, p + 4); */
                        }  /* else fail (s == NULL) */
                        break;
                    }
                    case 'f': {  /* frontier? */
                        const char *ep;
                        char previous;
                        p += 2;
                        if (*p != '[')
                            luaL_error(ms->L, "missing '[' after '%%f' in pattern");
                        ep = classend(ms, p);  /* points to what is next */
                        previous = (s == ms->src_init) ? '\0' : *(s - 1);
                        if (!matchbracketclass(uchar(previous), p, ep - 1) &&
                            matchbracketclass(uchar(*s), p, ep - 1)) {
                            p = ep;
                            goto init;  /* return match(ms, s, ep); */
                        }
                        s = NULL;  /* match failed */
                        break;
                    }
                    case '0':
                    case '1':
                    case '2':
                    case '3':
                    case '4':
                    case '5':
                    case '6':
                    case '7':
                    case '8':
                    case '9': {  /* capture results (%0-%9)? */
                        s = match_capture(ms, s, uchar(*(p + 1)));
                        if (s != NULL) {
                            p += 2;
                            goto init;  /* return match(ms, s, p + 2) */
                        }
                        break;
                    }
                    default:
                        goto dflt;
                }
                break;
            }
            default:
            dflt:
            {  /* pattern class plus optional suffix */
                const char *ep = classend(ms, p);  /* points to optional suffix */
                /* does not match at least once? */
                if (!singlematch(ms, s, p, ep)) {
                    if (*ep == '*' || *ep == '?' || *ep == '-') {  /* accept empty? */
                        p = ep + 1;
                        goto init;  /* return match(ms, s, ep + 1); */
                    } else  /* '+' or no suffix */
                        s = NULL;  /* fail */
                } else {  /* matched once */
                    switch (*ep) {  /* handle optional suffix */
                        case '?': {  /* optional */
                            const char *res;
                            if ((res = match(ms, s + 1, ep + 1)) != NULL)
                                s = res;
                            else {
                                p = ep + 1;
                                goto init;  /* else return match(ms, s, ep + 1); */
                            }
                            break;
                        }
                        case '+':  /* 1 or more repetitions */
                            s++;  /* 1 match already done */
                            /* FALLTHROUGH */
                        case '*':  /* 0 or more repetitions */
                            s = max_expand(ms, s, p, ep);
                            break;
                        case '-':  /* 0 or more repetitions (minimum) */
                            s = min_expand(ms, s, p, ep);
                            break;
                        default:  /* no suffix */
                            s++;
                            p = ep;
                            goto init;  /* return match(ms, s + 1, ep); */
                    }
                }
                break;
            }
        }
    }
    ms->matchdepth++;
    return s;
}